

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * askYesOrNo_abi_cxx11_(void)

{
  char *pcVar1;
  ostream *poVar2;
  string *in_RDI;
  bool bVar3;
  allocator local_12;
  undefined1 local_11;
  string *answer;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"abc",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
    bVar3 = false;
    if (*pcVar1 != 'y') {
      pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
      bVar3 = *pcVar1 != 'n';
    }
    if (!bVar3) break;
    std::operator>>((istream *)&std::cin,in_RDI);
    pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
    if ((*pcVar1 != 'y') &&
       (pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI), *pcVar1 != 'n')) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Type y or n.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Choice selected: ");
  pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
  poVar2 = std::operator<<(poVar2,*pcVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

string askYesOrNo() {
    string answer = "abc";
    while (answer.at(0) != 'y' && answer.at(0) != 'n') {
        cin >> answer;
        if (answer.at(0) != 'y' && answer.at(0) != 'n') cout << "Type y or n." << endl;
    }
    cout << "Choice selected: " << answer.at(0) << endl;
    return answer;
}